

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

IntrinsicResult MiniScript::intrinsic_code(Context *context,IntrinsicResult partialResult)

{
  unsigned_long uVar1;
  TextOutputMethod inBuf;
  Value self;
  Interpreter *local_48 [2];
  Value local_38;
  String local_28;
  
  String::String(&local_28,"self");
  Context::GetVar((Context *)&self,(String *)partialResult.rs,(LocalOnlyMode)&local_28);
  String::~String(&local_28);
  if (self.type == Null) {
    local_38.data.number = 0.0;
  }
  else {
    Value::ToString((Value *)local_48,(Machine *)&self);
    if (local_48[0] == (Interpreter *)0x0) {
      inBuf = (TextOutputMethod)0x14a81e;
    }
    else {
      inBuf = local_48[0]->implicitOutput;
    }
    uVar1 = UTF8Decode((uchar *)inBuf);
    String::~String((String *)local_48);
    local_38.data.number = (double)(long)uVar1;
  }
  local_38.type = Number;
  local_38.noInvoke = false;
  local_38.localOnly = Off;
  IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_38,true);
  Value::~Value(&local_38);
  Value::~Value(&self);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_code(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		long codepoint = 0;
		if (not self.IsNull()) codepoint = UTF8Decode((unsigned char*)(self.ToString().c_str()));
		return IntrinsicResult(codepoint);
	}